

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

ES5ArrayTypeHandlerBase<int> * __thiscall
Js::DictionaryTypeHandlerBase<int>::ConvertToES5ArrayType
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  BYTE values;
  Recycler *pRVar4;
  ES5ArrayTypeHandlerBase<int> *pEVar5;
  undefined4 *puVar6;
  TrackAllocData local_50;
  ES5ArrayTypeHandlerBase<int> *local_28;
  ES5ArrayTypeHandlerBase<int> *newTypeHandler;
  Recycler *recycler;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  recycler = (Recycler *)instance;
  instance_local = (DynamicObject *)this;
  pRVar4 = RecyclableObject::GetRecycler(&instance->super_RecyclableObject);
  newTypeHandler = (ES5ArrayTypeHandlerBase<int> *)pRVar4;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&ES5ArrayTypeHandlerBase<int>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
             ,0x8d3);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_50);
  pEVar5 = (ES5ArrayTypeHandlerBase<int> *)new<Memory::Recycler>(0x40,pRVar4,0x43c4b0);
  ES5ArrayTypeHandlerBase<int>::ES5ArrayTypeHandlerBase(pEVar5,(Recycler *)newTypeHandler,this);
  local_28 = pEVar5;
  bVar2 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)pEVar5);
  if ((bVar2 & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x8d5,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pEVar5 = local_28;
  values = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetFlags((DynamicTypeHandler *)pEVar5,' ',values);
  ES5ArrayTypeHandlerBase<int>::SetInstanceTypeHandler(local_28,(DynamicObject *)recycler,true);
  return local_28;
}

Assistant:

ES5ArrayTypeHandlerBase<T>* DictionaryTypeHandlerBase<T>::ConvertToES5ArrayType(DynamicObject *instance)
    {
        Recycler* recycler = instance->GetRecycler();

        ES5ArrayTypeHandlerBase<T>* newTypeHandler = RecyclerNew(recycler, ES5ArrayTypeHandlerBase<T>, recycler, this);
        // Don't need to transfer the singleton instance, because the new handler takes over this handler.
        AssertMsg((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        // Property types were copied in the constructor.
        //newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesInlineSlotCapacityLocked, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);
        return newTypeHandler;
    }